

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_gvec_op3_env(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int rm,
                     gen_helper_gvec_3_ptr_conflict2 *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr ptr;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t oprsz;
  uint32_t maxsz;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_gvec_3_ptr_conflict2 *fn_local;
  int rm_local;
  int rn_local;
  int rd_local;
  _Bool is_q_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  dofs = vec_full_reg_offset(s,rd);
  aofs = vec_full_reg_offset(s,rn);
  bofs = vec_full_reg_offset(s,rm);
  ptr = tcg_ctx_00->cpu_env;
  oprsz = 8;
  if (is_q) {
    oprsz = 0x10;
  }
  maxsz = vec_full_reg_size(s);
  tcg_gen_gvec_3_ptr_aarch64(tcg_ctx_00,dofs,aofs,bofs,ptr,oprsz,maxsz,0,fn);
  return;
}

Assistant:

static void gen_gvec_op3_env(DisasContext *s, bool is_q, int rd,
                             int rn, int rm, gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       vec_full_reg_offset(s, rm), tcg_ctx->cpu_env,
                       is_q ? 16 : 8, vec_full_reg_size(s), 0, fn);
}